

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfileio.c
# Opt level: O2

int ffselect_table(fitsfile **fptr,char *outfile,char *expr,int *status)

{
  FITSfile *pFVar1;
  int iVar2;
  int iVar3;
  fitsfile *pfVar4;
  fitsfile *outfptr;
  int hdunum;
  fitsfile *newptr;
  
  if (*outfile == '\0') {
    pfVar4 = *fptr;
    outfptr = pfVar4;
    newptr = pfVar4;
LAB_0012cbbf:
    iVar2 = ffsrow(pfVar4,outfptr,expr,status);
    if (iVar2 < 1) {
      if (*outfile == '\0') goto LAB_0012ccf2;
      pfVar4 = *fptr;
      iVar2 = hdunum;
      if (pfVar4->Fptr->only_one == 0) {
        while( true ) {
          iVar3 = ffmahd(pfVar4,iVar2 + 1,(int *)0x0,status);
          if (0 < iVar3) break;
          ffcopy(*fptr,outfptr,0,status);
          pfVar4 = *fptr;
          iVar2 = iVar2 + 1;
        }
        if (*status == 0x6b) {
          *status = 0;
        }
        else if (0 < *status) goto LAB_0012cce7;
      }
      else {
        hdunum = 2;
      }
      ffclos(*fptr,status);
      *fptr = outfptr;
      ffmahd(outfptr,hdunum,(int *)0x0,status);
      goto LAB_0012ccf2;
    }
    if (*outfile == '\0') goto LAB_0012ccf2;
  }
  else {
    iVar2 = ffinit(&newptr,outfile,status);
    if (0 < iVar2) {
      ffpmsg("failed to create file for selected rows from input table");
      ffpmsg(outfile);
      goto LAB_0012ccf2;
    }
    ffghdn(*fptr,&hdunum);
    outfptr = newptr;
    if ((*fptr)->Fptr->only_one == 0) {
      iVar2 = 1;
      do {
        if (hdunum <= iVar2) goto LAB_0012cc32;
        ffmahd(*fptr,iVar2,(int *)0x0,status);
        iVar3 = ffcopy(*fptr,outfptr,0,status);
        iVar2 = iVar2 + 1;
      } while (iVar3 < 1);
    }
    else {
      ffmahd(*fptr,1,(int *)0x0,status);
      outfptr = newptr;
      iVar2 = ffcopy(*fptr,newptr,0,status);
      if (iVar2 < 1) {
LAB_0012cc32:
        ffmahd(*fptr,hdunum,(int *)0x0,status);
        iVar2 = ffcphd(*fptr,outfptr,status);
        if (iVar2 < 1) {
          ffmkyj(outfptr,"NAXIS2",0,(char *)0x0,status);
          pFVar1 = outfptr->Fptr;
          pFVar1->origrows = 0;
          pFVar1->numrows = 0;
          iVar2 = ffrdef(outfptr,status);
          if (iVar2 < 1) {
            pfVar4 = *fptr;
            goto LAB_0012cbbf;
          }
        }
      }
    }
  }
LAB_0012cce7:
  ffclos(outfptr,status);
LAB_0012ccf2:
  return *status;
}

Assistant:

int ffselect_table(
           fitsfile **fptr,  /* IO - pointer to input table; on output it  */
                             /*      points to the new selected rows table */
           char *outfile,    /* I - name for output file */
           char *expr,       /* I - Boolean expression    */
           int *status)
{
    fitsfile *newptr;
    int ii, hdunum;

    if (*outfile)
    {
      /* create new empty file in to hold the selected rows */
      if (ffinit(&newptr, outfile, status) > 0)
      {
        ffpmsg(
         "failed to create file for selected rows from input table");
        ffpmsg(outfile);
        return(*status);
      }

      fits_get_hdu_num(*fptr, &hdunum);  /* current HDU number in input file */

      /* copy all preceding extensions to the output file, if the 'only_one' flag is not set */
      if (!((*fptr)->Fptr)->only_one) {
        for (ii = 1; ii < hdunum; ii++)
        {
          fits_movabs_hdu(*fptr, ii, NULL, status);
          if (fits_copy_hdu(*fptr, newptr, 0, status) > 0)
          {
            ffclos(newptr, status);
            return(*status);
          }
        }
      } else {
          /* just copy the primary array */
          fits_movabs_hdu(*fptr, 1, NULL, status);
          if (fits_copy_hdu(*fptr, newptr, 0, status) > 0)
          {
            ffclos(newptr, status);
            return(*status);
          }
      }
      
      fits_movabs_hdu(*fptr, hdunum, NULL, status);

      /* copy all the header keywords from the input to output file */
      if (fits_copy_header(*fptr, newptr, status) > 0)
      {
        ffclos(newptr, status);
        return(*status);
      }

      /* set number of rows = 0 */
      fits_modify_key_lng(newptr, "NAXIS2", 0, NULL,status);
      (newptr->Fptr)->numrows = 0;
      (newptr->Fptr)->origrows = 0;

      if (ffrdef(newptr, status) > 0)  /* force the header to be scanned */
      {
        ffclos(newptr, status);
        return(*status);
      }
    }
    else
        newptr = *fptr;  /* will delete rows in place in the table */

    /* copy rows which satisfy the selection expression to the output table */
    /* or delete the nonqualifying rows if *fptr = newptr.   */
    if (fits_select_rows(*fptr, newptr, expr, status) > 0)
    {
        if (*outfile)
            ffclos(newptr, status);

        return(*status);
    }

    if (*outfile)
    {
      /* copy any remaining HDUs to the output copy */

      if (!((*fptr)->Fptr)->only_one) {
        for (ii = hdunum + 1; 1; ii++)
        {
          if (fits_movabs_hdu(*fptr, ii, NULL, status) > 0)
            break;

          fits_copy_hdu(*fptr, newptr, 0, status);
        }

        if (*status == END_OF_FILE)   
          *status = 0;              /* got the expected EOF error; reset = 0  */
        else if (*status > 0)
        {
          ffclos(newptr, status);
          return(*status);
        }
      } else {
        hdunum = 2;
      }

      /* close the original file and return ptr to the new image */
      ffclos(*fptr, status);

      *fptr = newptr; /* reset the pointer to the new table */

      /* move back to the selected table HDU */
      fits_movabs_hdu(*fptr, hdunum, NULL, status);
    }

    return(*status);
}